

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O2

bool __thiscall ON_FixedSizePool::ElementIdIsIncreasing(ON_FixedSizePool *this,size_t id_offset)

{
  uint uVar1;
  ulong uVar2;
  char *sFormat;
  undefined8 *puVar3;
  uint *puVar4;
  int line_number;
  undefined8 *puVar5;
  undefined8 *puVar6;
  uint uVar7;
  bool bVar8;
  void **ppvVar9;
  
  uVar2 = this->m_sizeof_element;
  if ((uVar2 & 3) == 0) {
    if (id_offset < 8) {
      sFormat = "id_offset is too small.";
      line_number = 0x40b;
    }
    else {
      if (id_offset + 4 <= uVar2) {
        bVar8 = true;
        uVar7 = 0;
        puVar5 = (undefined8 *)this->m_first_block;
        do {
          do {
            if (puVar5 == (undefined8 *)0x0) {
              return true;
            }
            if (puVar5 == (undefined8 *)this->m_al_block) {
              puVar6 = (undefined8 *)0x0;
              ppvVar9 = &this->m_al_element_array;
            }
            else {
              puVar6 = (undefined8 *)*puVar5;
              ppvVar9 = (void **)(puVar5 + 1);
            }
            puVar3 = puVar5 + 2;
            puVar5 = puVar6;
          } while ((ulong)((long)*ppvVar9 - (long)puVar3) < uVar2);
          puVar4 = (uint *)((long)puVar3 + id_offset);
          if (bVar8) {
            uVar7 = *puVar4;
            puVar4 = (uint *)((long)puVar4 + uVar2);
          }
          for (; puVar4 <= (uint *)((long)*ppvVar9 + (id_offset - uVar2));
              puVar4 = (uint *)((long)puVar4 + (uVar2 & 0xfffffffffffffffc))) {
            uVar1 = *puVar4;
            if (uVar1 <= uVar7) {
              return false;
            }
            uVar7 = uVar1;
          }
          bVar8 = false;
        } while( true );
      }
      sFormat = "id_offset is too large.";
      line_number = 0x411;
    }
  }
  else {
    sFormat = "m_sizeof_element must be a multiple of sizeof(unsigned int).";
    line_number = 0x405;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
             ,line_number,"",sFormat);
  return false;
}

Assistant:

bool ON_FixedSizePool::ElementIdIsIncreasing(
  size_t id_offset
) const
{
  const char* block;
  const char* block_end;
  const char* next_block;
  const unsigned int* i0;
  const unsigned int* i1;
  unsigned int prev_id = 0;
  unsigned int id;
  bool bFirstId = true;
  size_t count;
  if (0 != ( m_sizeof_element % sizeof(id)) )
  {
    // caller is confused.
    ON_ERROR("m_sizeof_element must be a multiple of sizeof(unsigned int).");
    return false;
  }
  if (id_offset < sizeof(void*) )
  {
    // caller is confused.
    ON_ERROR("id_offset is too small.");
    return false;
  }
  if (id_offset + sizeof(prev_id) > m_sizeof_element)
  {
    // caller is confused.
    ON_ERROR("id_offset is too large.");
    return false;
  }

  const size_t delta_i = m_sizeof_element / sizeof(id);
  for (block = (const char*)m_first_block; 0 != block; block = next_block)
  {
    if (block == m_al_block)
    {
      next_block = nullptr;
      block_end = (const char*)m_al_element_array;
      block += (2 * sizeof(void*));
    }
    else
    {
      next_block = *((const char**)block);
      block += sizeof(void*);
      block_end = *((const char**)(block));
      block += sizeof(void*);
    }

    count = (block_end - block)/m_sizeof_element;
    if (0 == count)
      continue;

    i0 = ((const unsigned int*)(block + id_offset));
    i1 = ((const unsigned int*)(block_end-(m_sizeof_element-id_offset)));

    if (bFirstId)
    {
      prev_id = *i0;
      bFirstId = false;
      i0 += delta_i;
    }
    while (i0 <= i1)
    {
      id = *i0;
      if (id <= prev_id)
        return false;
      prev_id = id;
      i0 += delta_i;
    }
  }

  return true;
}